

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

int fy_emit_push_state(fy_emitter *emit,fy_emitter_state state)

{
  fy_emitter_state *__dest;
  fy_emitter_state *__ptr;
  ulong uVar1;
  
  uVar1 = (ulong)emit->state_stack_top;
  __dest = emit->state_stack;
  if (emit->state_stack_alloc <= emit->state_stack_top) {
    __ptr = (fy_emitter_state *)0x0;
    if (__dest != emit->state_stack_inplace) {
      __ptr = __dest;
    }
    __dest = (fy_emitter_state *)realloc(__ptr,(ulong)emit->state_stack_alloc << 3);
    uVar1 = (ulong)emit->state_stack_top;
    if (emit->state_stack == emit->state_stack_inplace) {
      memcpy(__dest,emit->state_stack,uVar1 * 4);
    }
    emit->state_stack = __dest;
    emit->state_stack_alloc = emit->state_stack_alloc << 1;
  }
  emit->state_stack_top = (int)uVar1 + 1;
  __dest[uVar1] = state;
  return (int)uVar1;
}

Assistant:

static int fy_emit_push_state(struct fy_emitter *emit, enum fy_emitter_state state) {
    enum fy_emitter_state *states;

    if (emit->state_stack_top >= emit->state_stack_alloc) {
        states = realloc(emit->state_stack == emit->state_stack_inplace ? NULL : emit->state_stack,
                         sizeof(emit->state_stack[0]) * emit->state_stack_alloc * 2);
        if (!state)
            return -1;

        if (emit->state_stack == emit->state_stack_inplace)
            memcpy(states, emit->state_stack, sizeof(emit->state_stack[0]) * emit->state_stack_top);
        emit->state_stack = states;
        emit->state_stack_alloc *= 2;
    }
    emit->state_stack[emit->state_stack_top++] = state;

    return 0;
}